

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out.c
# Opt level: O2

LY_ERR ly_write_(ly_out *out,char *buf,size_t len)

{
  undefined1 (*pauVar1) [16];
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  int *piVar5;
  char *pcVar6;
  char **ppcVar7;
  LY_ERR LVar8;
  size_t sVar9;
  int iVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  iVar10 = (int)len;
  if (out->hole_count == 0) {
    pauVar1 = (undefined1 (*) [16])((long)&out->method + 8);
    sVar3 = 0;
    do {
      sVar4 = sVar3;
      switch(out->type) {
      case LY_OUT_FD:
        sVar4 = write((out->method).fd,buf,len);
        break;
      case LY_OUT_FDSTREAM:
      case LY_OUT_FILE:
      case LY_OUT_FILEPATH:
        sVar3 = fwrite(buf,1,len,(FILE *)(out->method).f);
        if (sVar3 == len) goto LAB_00139647;
        goto LAB_001394f3;
      case LY_OUT_MEMORY:
        ppcVar7 = (out->method).mem.buf;
        pcVar2 = (out->method).fpath.filepath;
        if ((char *)(out->method).mem.size < pcVar2 + len + 1) {
          pcVar6 = (char *)ly_realloc(*ppcVar7,(size_t)(pcVar2 + (len - ((uint)(pcVar2 + len + 1) &
                                                                        0x3ff)) + 0x401));
          *(out->method).mem.buf = pcVar6;
          ppcVar7 = (out->method).mem.buf;
          if (*ppcVar7 == (char *)0x0) {
            *pauVar1 = (undefined1  [16])0x0;
            goto LAB_0013953b;
          }
          (out->method).mem.size =
               (size_t)(pcVar2 + (len - ((uint)(pcVar2 + len + 1) & 0x3ff)) + 0x401);
          pcVar2 = (out->method).fpath.filepath;
        }
        if (len != 0) {
          memcpy(pcVar2 + (long)*ppcVar7,buf,len);
          ppcVar7 = (out->method).mem.buf;
          pcVar2 = (out->method).fpath.filepath;
        }
        *(char **)*pauVar1 = pcVar2 + len;
        (*ppcVar7)[(long)(pcVar2 + len)] = '\0';
        goto LAB_00139647;
      case LY_OUT_CALLBACK:
        sVar4 = (*(out->method).clb.func)((out->method).fpath.filepath,buf,len);
        break;
      case LY_OUT_ERROR:
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/out.c",0x282)
        ;
        return LY_EINT;
      default:
        goto switchD_001394b0_default;
      }
      if (-1 < (long)sVar4) {
switchD_001394b0_default:
        if (len == sVar4) {
LAB_00139647:
          if (out->type == LY_OUT_FDSTREAM) {
            lseek(*(int *)*pauVar1,0,2);
          }
          LVar8 = LY_SUCCESS;
        }
        else {
          LVar8 = LY_ESYS;
          ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,
                 "%s: writing data failed (unable to write %u from %u data).","ly_write_",
                 (ulong)(uint)(iVar10 - (int)sVar4),iVar10);
          len = sVar4;
        }
        goto LAB_00139666;
      }
LAB_001394f3:
      piVar5 = __errno_location();
    } while (*piVar5 == 0xb);
    pcVar2 = strerror(*piVar5);
    len = 0;
    LVar8 = LY_ESYS;
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,"%s: writing data failed (%s).","ly_write_",pcVar2);
LAB_00139666:
    auVar12._8_4_ = (int)len;
    auVar12._0_8_ = len;
    auVar12._12_4_ = (int)(len >> 0x20);
    out->printed = len + out->printed;
    out->func_printed = auVar12._8_8_ + out->func_printed;
  }
  else {
    sVar9 = out->buf_len;
    if (out->buf_size < sVar9 + len) {
      pcVar2 = (char *)ly_realloc(out->buffered,sVar9 + len);
      out->buffered = pcVar2;
      if (pcVar2 == (char *)0x0) {
        out->buf_len = 0;
        out->buf_size = 0;
LAB_0013953b:
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_write_");
        return LY_EMEM;
      }
      sVar9 = out->buf_len;
      out->buf_size = sVar9 + len;
    }
    if (len != 0) {
      memcpy(out->buffered + sVar9,buf,len);
      sVar9 = out->buf_len;
    }
    out->buf_len = sVar9 + len;
    auVar11._8_4_ = iVar10;
    auVar11._0_8_ = len;
    auVar11._12_4_ = (int)(len >> 0x20);
    out->printed = len + out->printed;
    out->func_printed = auVar11._8_8_ + out->func_printed;
    LVar8 = LY_SUCCESS;
  }
  return LVar8;
}

Assistant:

LY_ERR
ly_write_(struct ly_out *out, const char *buf, size_t len)
{
    LY_ERR ret = LY_SUCCESS;
    size_t written = 0, new_mem_size;

    if (out->hole_count) {
        /* we are buffering data after a hole */
        if (out->buf_len + len > out->buf_size) {
            out->buffered = ly_realloc(out->buffered, out->buf_len + len);
            if (!out->buffered) {
                out->buf_len = 0;
                out->buf_size = 0;
                LOGMEM(NULL);
                return LY_EMEM;
            }
            out->buf_size = out->buf_len + len;
        }

        if (len) {
            memcpy(&out->buffered[out->buf_len], buf, len);
        }
        out->buf_len += len;

        out->printed += len;
        out->func_printed += len;
        return LY_SUCCESS;
    }

repeat:
    switch (out->type) {
    case LY_OUT_MEMORY:
        new_mem_size = out->method.mem.len + len + 1;
        if (new_mem_size > out->method.mem.size) {
            new_mem_size = REALLOC_CHUNK(new_mem_size);
            *out->method.mem.buf = ly_realloc(*out->method.mem.buf, new_mem_size);
            if (!*out->method.mem.buf) {
                out->method.mem.len = 0;
                out->method.mem.size = 0;
                LOGMEM(NULL);
                return LY_EMEM;
            }
            out->method.mem.size = new_mem_size;
        }
        if (len) {
            memcpy(&(*out->method.mem.buf)[out->method.mem.len], buf, len);
        }
        out->method.mem.len += len;
        (*out->method.mem.buf)[out->method.mem.len] = '\0';

        written = len;
        break;
    case LY_OUT_FD: {
        ssize_t r;

        r = write(out->method.fd, buf, len);
        if (r < 0) {
            ret = LY_ESYS;
        } else {
            written = (size_t)r;
        }
        break;
    }
    case LY_OUT_FDSTREAM:
    case LY_OUT_FILEPATH:
    case LY_OUT_FILE:
        written = fwrite(buf, sizeof *buf, len, out->method.f);
        if (written != len) {
            ret = LY_ESYS;
        }
        break;
    case LY_OUT_CALLBACK: {
        ssize_t r;

        r = out->method.clb.func(out->method.clb.arg, buf, len);
        if (r < 0) {
            ret = LY_ESYS;
        } else {
            written = (size_t)r;
        }
        break;
    }
    case LY_OUT_ERROR:
        LOGINT(NULL);
        return LY_EINT;
    }

    if (ret) {
        if ((errno == EAGAIN) || (errno == EWOULDBLOCK)) {
            ret = LY_SUCCESS;
            goto repeat;
        }
        LOGERR(NULL, LY_ESYS, "%s: writing data failed (%s).", __func__, strerror(errno));
        written = 0;
    } else if (written != len) {
        LOGERR(NULL, LY_ESYS, "%s: writing data failed (unable to write %" PRIu32 " from %" PRIu32 " data).", __func__,
                (uint32_t)(len - written), (uint32_t)len);
        ret = LY_ESYS;
    } else {
        if (out->type == LY_OUT_FDSTREAM) {
            /* move the original file descriptor to the end of the output file */
            lseek(out->method.fdstream.fd, 0, SEEK_END);
        }
        ret = LY_SUCCESS;
    }

    out->printed += written;
    out->func_printed += written;
    return ret;
}